

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

TestObject * __thiscall kj::Arena::allocate<kj::(anonymous_namespace)::TestObject>(Arena *this)

{
  int iVar1;
  TestObject *ptr;
  Fault f;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  ptr = (TestObject *)allocateBytes(this,4,4,true);
  iVar1 = (anonymous_namespace)::TestObject::count;
  ptr->index = (anonymous_namespace)::TestObject::count;
  if (iVar1 != (anonymous_namespace)::TestObject::throwAt) {
    (anonymous_namespace)::TestObject::count = (anonymous_namespace)::TestObject::count + 1;
    setDestructor(this,ptr,destroyObject<kj::(anonymous_namespace)::TestObject>);
    return ptr;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  _::Debug::Fault::init
            (&local_30,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/arena-test.c++"
            );
  _::Debug::Fault::fatal(&local_30);
}

Assistant:

T& Arena::allocate(Params&&... params) {
  T& result = *reinterpret_cast<T*>(allocateBytes(
      sizeof(T), alignof(T), !__has_trivial_destructor(T)));
  if (!__has_trivial_constructor(T) || sizeof...(Params) > 0) {
    ctor(result, kj::fwd<Params>(params)...);
  }
  if (!__has_trivial_destructor(T)) {
    setDestructor(&result, &destroyObject<T>);
  }
  return result;
}